

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoopThreadPool.cpp
# Opt level: O3

vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_> * __thiscall
sznet::net::KcpTcpEventLoopThreadPool::getAllLoops
          (vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
           *__return_storage_ptr__,KcpTcpEventLoopThreadPool *this)

{
  KcpTcpEventLoop *pKVar1;
  bool bVar2;
  pointer ppKVar3;
  
  pKVar1 = this->m_baseLoop;
  bVar2 = EventLoop::isInLoopThread(&pKVar1->super_EventLoop);
  if (!bVar2) {
    EventLoop::abortNotInLoopThread(&pKVar1->super_EventLoop);
  }
  if (this->m_started != false) {
    if ((this->m_loops).
        super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->m_loops).
        super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppKVar3 = (pointer)operator_new(8);
      (__return_storage_ptr__->
      super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
      )._M_impl.super__Vector_impl_data._M_start = ppKVar3;
      (__return_storage_ptr__->
      super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage = ppKVar3 + 1;
      pKVar1 = this->m_baseLoop;
      (__return_storage_ptr__->
      super__Vector_base<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>
      )._M_impl.super__Vector_impl_data._M_finish = ppKVar3 + 1;
      *ppKVar3 = pKVar1;
    }
    else {
      std::vector<sznet::net::KcpTcpEventLoop_*,_std::allocator<sznet::net::KcpTcpEventLoop_*>_>::
      vector(__return_storage_ptr__,&this->m_loops);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("m_started",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoopThreadPool.cpp"
                ,0x5b,
                "std::vector<KcpTcpEventLoop *> sznet::net::KcpTcpEventLoopThreadPool::getAllLoops()"
               );
}

Assistant:

std::vector<KcpTcpEventLoop*> KcpTcpEventLoopThreadPool::getAllLoops()
{
	m_baseLoop->assertInLoopThread();
	assert(m_started);
	if (m_loops.empty())
	{
		return std::vector<KcpTcpEventLoop*>(1, m_baseLoop);
	}
	else
	{
		return m_loops;
	}
}